

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters.cpp
# Opt level: O2

QSslDiffieHellmanParameters __thiscall
QSslDiffieHellmanParameters::fromEncoded
          (QSslDiffieHellmanParameters *this,QIODevice *device,EncodingFormat encoding)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QSslDiffieHellmanParameters(this);
      return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
    }
  }
  else {
    QIODevice::readAll();
    fromEncoded(this,(QByteArray *)&QStack_38,encoding);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSslDiffieHellmanParameters QSslDiffieHellmanParameters::fromEncoded(QIODevice *device, QSsl::EncodingFormat encoding)
{
    if (device)
        return fromEncoded(device->readAll(), encoding);
    else
        return QSslDiffieHellmanParameters();
}